

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<unsigned_long,unsigned_long,duckdb::GreaterThanEquals,true,false,true,true>
                (unsigned_long *ldata,unsigned_long *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  ulong uVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  sel_t *psVar5;
  idx_t iVar6;
  sel_t sVar7;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  
  if (count + 0x3f < 0x40) {
    iVar6 = 0;
  }
  else {
    puVar1 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    iVar6 = 0;
    lVar9 = 0;
    uVar12 = 0;
    uVar13 = 0;
    do {
      uVar11 = uVar12;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar14 = uVar12 + 0x40;
        if (count <= uVar12 + 0x40) {
          uVar14 = count;
        }
LAB_0043d922:
        if (uVar12 < uVar14) {
          psVar3 = sel->sel_vector;
          uVar2 = *ldata;
          psVar4 = true_sel->sel_vector;
          psVar5 = false_sel->sel_vector;
          do {
            uVar11 = uVar12;
            if (psVar3 != (sel_t *)0x0) {
              uVar11 = (ulong)psVar3[uVar12];
            }
            uVar8 = rdata[uVar12];
            psVar4[iVar6] = (sel_t)uVar11;
            iVar6 = iVar6 + (uVar8 <= uVar2);
            psVar5[lVar9] = (sel_t)uVar11;
            lVar9 = lVar9 + (ulong)(uVar2 < uVar8);
            uVar12 = uVar12 + 1;
            uVar11 = uVar14;
          } while (uVar14 != uVar12);
        }
      }
      else {
        uVar2 = puVar1[uVar13];
        uVar14 = uVar12 + 0x40;
        if (count <= uVar12 + 0x40) {
          uVar14 = count;
        }
        if (uVar2 == 0xffffffffffffffff) goto LAB_0043d922;
        if (uVar2 == 0) {
          uVar11 = uVar14;
          if (uVar12 < uVar14) {
            psVar3 = sel->sel_vector;
            psVar4 = false_sel->sel_vector;
            do {
              uVar11 = uVar12;
              if (psVar3 != (sel_t *)0x0) {
                uVar11 = (ulong)psVar3[uVar12];
              }
              psVar4[lVar9] = (sel_t)uVar11;
              lVar9 = lVar9 + 1;
              uVar12 = uVar12 + 1;
              uVar11 = uVar14;
            } while (uVar14 != uVar12);
          }
        }
        else if (uVar12 < uVar14) {
          psVar3 = sel->sel_vector;
          psVar4 = true_sel->sel_vector;
          psVar5 = false_sel->sel_vector;
          uVar8 = 0;
          do {
            if (psVar3 == (sel_t *)0x0) {
              sVar7 = (int)uVar12 + (int)uVar8;
            }
            else {
              sVar7 = psVar3[uVar12 + uVar8];
            }
            if ((uVar2 >> (uVar8 & 0x3f) & 1) == 0) {
              bVar10 = false;
            }
            else {
              bVar10 = rdata[uVar12 + uVar8] <= *ldata;
            }
            psVar4[iVar6] = sVar7;
            iVar6 = iVar6 + bVar10;
            psVar5[lVar9] = sVar7;
            lVar9 = lVar9 + (ulong)(bVar10 ^ 1);
            uVar8 = uVar8 + 1;
            uVar11 = uVar14;
          } while (uVar14 - uVar12 != uVar8);
        }
      }
      uVar12 = uVar11;
      uVar13 = uVar13 + 1;
    } while (uVar13 != count + 0x3f >> 6);
  }
  return iVar6;
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}